

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O1

int __thiscall
lossless_neural_sound::expression_compiler::expression::Transfer_function::
structurally_compare_implementation(Transfer_function *this,Expression_node *rt)

{
  _func_int **pp_Var1;
  Node *pNVar2;
  uint in_EAX;
  uint uVar3;
  
  if (rt == (Expression_node *)0x0) {
    __assert_fail("rt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                  ,0x575,
                  "virtual int lossless_neural_sound::expression_compiler::expression::Transfer_function::structurally_compare_implementation(const Expression_node *) const"
                 );
  }
  pp_Var1 = (rt->super_Node)._vptr_Node;
  if (pp_Var1 == (_func_int **)&PTR__Node_00127cf0) {
    pNVar2 = rt[1].super_Node.hash_next;
    in_EAX = 0xffffffff;
    if ((pNVar2 <= (Node *)this->derivative_count) &&
       (in_EAX = 1, (Node *)this->derivative_count <= pNVar2)) {
      in_EAX = Expression_node::structurally_compare
                         (this->arg,(Expression_node *)rt[1].super_Node._vptr_Node);
    }
  }
  if (pp_Var1 != (_func_int **)&PTR__Node_00127cf0) {
    uVar3 = (*(rt->super_Node)._vptr_Node[6])(rt);
    in_EAX = 0xffffffff;
    if (uVar3 < 5) {
      in_EAX = (uint)(uVar3 != 4);
    }
  }
  return in_EAX;
}

Assistant:

virtual int structurally_compare_implementation(const Expression_node *rt) const
        noexcept override
    {
        assert(rt);
        if(auto *fn = dynamic_cast<const Transfer_function *>(rt))
        {
            if(derivative_count < fn->derivative_count)
                return -1;
            if(derivative_count > fn->derivative_count)
                return 1;
            return arg->structurally_compare(fn->arg);
        }
        auto rt_kind = rt->get_kind();
        if(Kind::Transfer_function < rt_kind)
            return -1;
        if(Kind::Transfer_function > rt_kind)
            return 1;
        return 0;
    }